

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::RegisterTests
          (ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>
           *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  reference pIVar5;
  ulong uVar6;
  ostream *poVar7;
  size_type sVar8;
  void *this_01;
  char *pcVar9;
  char *value_param;
  element_type *peVar10;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  pointer pTVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  CodeLocation local_230;
  undefined8 local_208;
  CodeLocation local_200;
  string local_1d8;
  string local_1b8;
  _Base_ptr local_198;
  undefined1 local_190;
  GTestLog local_188;
  GTestLog local_184;
  TestParamInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Case> local_180;
  undefined1 local_170 [8];
  string param_name;
  Fixed32Case *param;
  iterator __end0_2;
  iterator __begin0_2;
  ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> *__range5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  int local_d4;
  char *pcStack_d0;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  undefined1 local_b0 [8];
  ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> generator;
  string *instantiation_name;
  InstantiationInfo *instantiation;
  iterator __end0_1;
  iterator __begin0_1;
  InstantiationContainer *__range4;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>
  *test_info;
  iterator __end0;
  iterator __begin0;
  TestInfoContainer *__range3;
  string test_name;
  string test_suite_name;
  bool generated_instantiations;
  ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases> *this_local;
  
  bVar2 = false;
  std::__cxx11::string::string((string *)(test_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range3);
  __end0 = std::
           vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>
           ::begin(&this->tests_);
  test_info = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>
               *)std::
                 vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>
                 ::end(&this->tests_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>_>
                                     *)&test_info), bVar1) {
    this_00 = (__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>_>
                 ::operator*(&__end0);
    __end0_1 = std::
               vector<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo>_>
               ::begin(&this->instantiations_);
    instantiation =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo>_>
         ::end(&this->instantiations_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo>_>_>
                               *)&instantiation), bVar1) {
      pIVar5 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo>_>_>
               ::operator*(&__end0_1);
      generator.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar5;
      (*pIVar5->generator)(local_b0);
      file = (char *)pIVar5->name_func;
      pcStack_d0 = pIVar5->file;
      local_d4 = pIVar5->line;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,"/");
        std::__cxx11::string::operator=((string *)(test_name.field_2._M_local_buf + 8),(string *)&i)
        ;
        std::__cxx11::string::~string((string *)&i);
      }
      else {
        std::__cxx11::string::clear();
      }
      std::__cxx11::string::operator+=
                ((string *)(test_name.field_2._M_local_buf + 8),(string *)&this->test_suite_name_);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range5);
      ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::begin
                ((ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> *)
                 &__end0_2);
      ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::end
                ((ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> *)&param)
      ;
      while (bVar1 = ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::
                     operator!=(&__end0_2,
                                (ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>
                                 *)&param), bVar1) {
        param_name.field_2._8_8_ =
             ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::operator*
                       (&__end0_2);
        bVar2 = true;
        std::__cxx11::string::clear();
        pcVar9 = file;
        TestParamInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::TestParamInfo
                  (&local_180,(Fixed32Case *)param_name.field_2._8_8_,
                   test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*(code *)pcVar9)(local_170,&local_180);
        bVar1 = IsValidParamName((string *)local_170);
        bVar1 = IsTrue(bVar1);
        if (!bVar1) {
          GTestLog::GTestLog(&local_184,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar7 = GTestLog::GetStream(&local_184);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          poVar7 = std::operator<<(poVar7,"Parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_170);
          poVar7 = std::operator<<(poVar7,
                                   "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                  );
          poVar7 = std::operator<<(poVar7,pcStack_d0);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d4);
          poVar7 = std::operator<<(poVar7,anon_var_dwarf_37cdd0 + 5);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_184);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range5,(key_type *)local_170);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog(&local_188,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar7 = GTestLog::GetStream(&local_188);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_170);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,pcStack_d0);
          poVar7 = std::operator<<(poVar7," line ");
          this_01 = (void *)std::ostream::operator<<(poVar7,local_d4);
          std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_188);
        }
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(this_00);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->(this_00);
          pcVar9 = (char *)std::__cxx11::string::append((string *)&__range3);
          std::__cxx11::string::append(pcVar9);
        }
        std::__cxx11::string::operator+=((string *)&__range3,(string *)local_170);
        pVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range5,(value_type *)local_170);
        local_198 = (_Base_ptr)pVar12.first._M_node;
        local_190 = pVar12.second;
        std::__cxx11::string::string
                  ((string *)&local_1b8,(string *)(test_name.field_2._M_local_buf + 8));
        pcVar9 = (char *)std::__cxx11::string::c_str();
        PrintToString<google::protobuf::io::(anonymous_namespace)::Fixed32Case>
                  (&local_1d8,(Fixed32Case *)param_name.field_2._8_8_);
        value_param = (char *)std::__cxx11::string::c_str();
        peVar10 = std::
                  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        CodeLocation::CodeLocation(&local_200,&peVar10->code_location);
        iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])();
        set_up_tc = SuiteApiResolver<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::
                    GetSetUpCaseOrSuite(pcStack_d0,local_d4);
        tear_down_tc = SuiteApiResolver<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::
                       GetTearDownCaseOrSuite(pcStack_d0,local_d4);
        peVar10 = std::
                  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        pTVar11 = std::
                  unique_ptr<testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::io::(anonymous_namespace)::Fixed32Case>_>_>
                  ::operator->(&peVar10->test_meta_factory);
        local_208 = *(undefined8 *)param_name.field_2._8_8_;
        iVar3 = (*pTVar11->_vptr_TestMetaFactoryBase[2])(pTVar11,local_208);
        MakeAndRegisterTestInfo
                  (&local_1b8,pcVar9,(char *)0x0,value_param,&local_200,
                   (TypeId)CONCAT44(extraout_var,iVar4),set_up_tc,tear_down_tc,
                   (TestFactoryBase *)CONCAT44(extraout_var_00,iVar3));
        CodeLocation::~CodeLocation(&local_200);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1b8);
        test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
             test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        std::__cxx11::string::~string((string *)local_170);
        ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::operator++
                  (&__end0_2);
      }
      ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::~ParamIterator
                ((ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> *)&param);
      ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::~ParamIterator
                (&__end0_2);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range5);
      ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case>::~ParamGenerator
                ((ParamGenerator<google::protobuf::io::(anonymous_namespace)::Fixed32Case> *)
                 local_b0);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::InstantiationInfo>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>_>
    ::operator++(&__end0);
  }
  if (!bVar2) {
    iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      ();
    CodeLocation::CodeLocation(&local_230,&this->code_location_);
    bVar2 = std::
            vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::io::(anonymous_namespace)::Fixed32Cases>::TestInfo>_>_>
            ::empty(&this->tests_);
    InsertSyntheticTestCase((string *)CONCAT44(extraout_var_01,iVar4),&local_230,!bVar2);
    CodeLocation::~CodeLocation(&local_230);
  }
  std::__cxx11::string::~string((string *)&__range3);
  std::__cxx11::string::~string((string *)(test_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }